

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_test.cpp
# Opt level: O0

void __thiscall UnicodeTest_Illegal_Test::UnicodeTest_Illegal_Test(UnicodeTest_Illegal_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__UnicodeTest_Illegal_Test_00248188;
  return;
}

Assistant:

TEST(UnicodeTest, Illegal) {
  string s = "123\x80";
  RuneStrArray runes;
  ASSERT_FALSE(DecodeRunesInString(s, runes));
  string actual;
  string expected = "[]";
  actual << runes;
  ASSERT_EQ(expected, actual);
}